

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall FPlayerNameBox::DrawBorder(FPlayerNameBox *this,int x,int y,int len)

{
  DFrameBuffer *pDVar1;
  FTextureID FVar2;
  int iVar3;
  FTexture *pFVar4;
  FTexture *img;
  FTexture *img_00;
  FTexture *slot;
  int i;
  FTexture *right;
  FTexture *mid;
  FTexture *left;
  int len_local;
  int y_local;
  int x_local;
  FPlayerNameBox *this_local;
  
  FVar2 = FTextureManager::CheckForTexture(&TexMan,"M_LSLEFT",8,1);
  pFVar4 = FTextureManager::operator[](&TexMan,FVar2);
  FVar2 = FTextureManager::CheckForTexture(&TexMan,"M_LSCNTR",8,1);
  img = FTextureManager::operator[](&TexMan,FVar2);
  FVar2 = FTextureManager::CheckForTexture(&TexMan,"M_LSRGHT",8,1);
  img_00 = FTextureManager::operator[](&TexMan,FVar2);
  if (((pFVar4 == (FTexture *)0x0) || (img_00 == (FTexture *)0x0)) || (img == (FTexture *)0x0)) {
    FVar2 = FTextureManager::CheckForTexture(&TexMan,"M_FSLOT",8,1);
    pFVar4 = FTextureManager::operator[](&TexMan,FVar2);
    pDVar1 = screen;
    if (pFVar4 == (FTexture *)0x0) {
      iVar3 = FFont::GetHeight(SmallFont);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (pDVar1,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)(x + len),
                 (ulong)(uint)(y + (iVar3 * 3) / 2),0xffffffff,0);
    }
    else {
      DCanvas::DrawTexture((DCanvas *)screen,pFVar4,(double)x,(double)(y + 1),0x40001390,1,0);
    }
  }
  else {
    DCanvas::DrawTexture((DCanvas *)screen,pFVar4,(double)(x + -8),(double)(y + 7),0x40001390,1,0);
    len_local = x;
    for (slot._0_4_ = 0; (int)slot < len; slot._0_4_ = (int)slot + 1) {
      DCanvas::DrawTexture((DCanvas *)screen,img,(double)len_local,(double)(y + 7),0x40001390,1,0);
      len_local = len_local + 8;
    }
    DCanvas::DrawTexture((DCanvas *)screen,img_00,(double)len_local,(double)(y + 7),0x40001390,1,0);
  }
  return;
}

Assistant:

void FPlayerNameBox::DrawBorder (int x, int y, int len)
{
	FTexture *left = TexMan[TexMan.CheckForTexture("M_LSLEFT", FTexture::TEX_MiscPatch)];
	FTexture *mid = TexMan[TexMan.CheckForTexture("M_LSCNTR", FTexture::TEX_MiscPatch)];
	FTexture *right = TexMan[TexMan.CheckForTexture("M_LSRGHT", FTexture::TEX_MiscPatch)];
	if (left != NULL && right != NULL && mid != NULL)
	{
		int i;

		screen->DrawTexture (left, x-8, y+7, DTA_Clean, true, TAG_DONE);

		for (i = 0; i < len; i++)
		{
			screen->DrawTexture (mid, x, y+7, DTA_Clean, true, TAG_DONE);
			x += 8;
		}

		screen->DrawTexture (right, x, y+7, DTA_Clean, true, TAG_DONE);
	}
	else
	{
		FTexture *slot = TexMan[TexMan.CheckForTexture("M_FSLOT", FTexture::TEX_MiscPatch)];
		if (slot != NULL)
		{
			screen->DrawTexture (slot, x, y+1, DTA_Clean, true, TAG_DONE);
		}
		else
		{
			screen->Clear(x, y, x + len, y + SmallFont->GetHeight() * 3/2, -1, 0);
		}
	}
}